

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

void draw_shape(element_t *element,render_context_t *context,render_state_t *state)

{
  plutovg_canvas_t *ppVar1;
  _Bool _Var2;
  float fVar3;
  float local_6b0;
  int local_6ac;
  float local_6a8;
  int i;
  float dashes [128];
  stroke_dash_array_t dash_array;
  length_t dash_offset;
  float stroke_opacity;
  plutovg_fill_rule_t fill_rule;
  float fill_opacity;
  paint_t fill;
  float local_60;
  float delta;
  float join_limit;
  float cap_limit;
  float line_width;
  float miter_limit;
  plutovg_line_join_t line_join;
  plutovg_line_cap_t line_cap;
  length_t stroke_width;
  paint_t stroke;
  render_state_t *state_local;
  render_context_t *context_local;
  element_t *element_local;
  
  memset(&stroke_width,0,0x20);
  parse_paint(element,0x1d,(paint_t *)&stroke_width);
  line_join = 0x3f800000;
  line_cap = length_type_fixed;
  miter_limit = 0.0;
  line_width = 0.0;
  cap_limit = 4.0;
  if (stroke_width.value != 0.0) {
    parse_length(element,0x24,(length_t *)&line_join,false,true);
    parse_line_cap(element,0x20,(plutovg_line_cap_t *)&miter_limit);
    parse_line_join(element,0x21,(plutovg_line_join_t *)&line_width);
    parse_number(element,0x22,&cap_limit,false,true);
  }
  if (state->mode == render_mode_bounding) {
    if (stroke_width.value != 0.0) {
      local_60 = resolve_length(state,(length_t *)&line_join,'o');
      delta = local_60 / 2.0;
      if (miter_limit == 2.8026e-45) {
        delta = delta * 1.4142135;
      }
      local_60 = local_60 / 2.0;
      if (line_width == 0.0) {
        local_60 = cap_limit * local_60;
      }
      if (delta <= local_60) {
        local_6b0 = local_60;
      }
      else {
        local_6b0 = delta;
      }
      (state->extents).x = (state->extents).x - local_6b0;
      (state->extents).y = (state->extents).y - local_6b0;
      (state->extents).w = local_6b0 + local_6b0 + (state->extents).w;
      (state->extents).h = local_6b0 + local_6b0 + (state->extents).h;
    }
  }
  else {
    fill_rule = paint_type_color;
    fill_opacity = 0.0;
    fill.type = 0xff000000;
    fill.color.type = color_type_fixed;
    fill.color.value = 0;
    fill._12_4_ = 0;
    fill.id.data = (char *)0x0;
    parse_paint(element,9,(paint_t *)&fill_rule);
    _Var2 = apply_paint(state,context,(paint_t *)&fill_rule);
    if (_Var2) {
      stroke_opacity = 1.0;
      parse_number(element,10,&stroke_opacity,true,true);
      dash_offset.type = length_type_unknown;
      parse_fill_rule(element,0xb,&dash_offset.type);
      plutovg_canvas_set_fill_rule(context->canvas,dash_offset.type);
      plutovg_canvas_set_opacity(context->canvas,stroke_opacity * state->opacity);
      plutovg_canvas_set_matrix(context->canvas,&state->matrix);
      plutovg_canvas_fill_path(context->canvas,context->document->path);
    }
    _Var2 = apply_paint(state,context,(paint_t *)&stroke_width);
    if (_Var2) {
      dash_offset.value = 1.0;
      parse_number(element,0x23,&dash_offset.value,true,true);
      stack0xffffffffffffff64 = 0x100000000;
      parse_length(element,0x1f,(length_t *)((long)&dash_array.size + 4),false,true);
      memset(dashes + 0x7e,0,0x408);
      parse_dash_array(element,0x1e,(stroke_dash_array_t *)(dashes + 0x7e));
      for (local_6ac = 0; (ulong)(long)local_6ac < (ulong)dash_array.data[0x7f];
          local_6ac = local_6ac + 1) {
        fVar3 = resolve_length(state,dash_array.data + (long)local_6ac + -1,'o');
        (&local_6a8)[local_6ac] = fVar3;
      }
      ppVar1 = context->canvas;
      fVar3 = resolve_length(state,(length_t *)((long)&dash_array.size + 4),'o');
      plutovg_canvas_set_dash_offset(ppVar1,fVar3);
      plutovg_canvas_set_dash_array(context->canvas,&local_6a8,(int)dash_array.data[0x7f].value);
      ppVar1 = context->canvas;
      fVar3 = resolve_length(state,(length_t *)&line_join,'o');
      plutovg_canvas_set_line_width(ppVar1,fVar3);
      plutovg_canvas_set_line_cap(context->canvas,(plutovg_line_cap_t)miter_limit);
      plutovg_canvas_set_line_join(context->canvas,(plutovg_line_join_t)line_width);
      plutovg_canvas_set_miter_limit(context->canvas,cap_limit);
      plutovg_canvas_set_opacity(context->canvas,dash_offset.value * state->opacity);
      plutovg_canvas_set_matrix(context->canvas,&state->matrix);
      plutovg_canvas_stroke_path(context->canvas,context->document->path);
    }
  }
  return;
}

Assistant:

static void draw_shape(const element_t* element, const render_context_t* context, render_state_t* state)
{
    paint_t stroke = {paint_type_none};
    parse_paint(element, ATTR_STROKE, &stroke);

    length_t stroke_width = {1.f, length_type_fixed};
    plutovg_line_cap_t line_cap = PLUTOVG_LINE_CAP_BUTT;
    plutovg_line_join_t line_join = PLUTOVG_LINE_JOIN_MITER;
    float miter_limit = 4.f;

    if(stroke.type > paint_type_none) {
        parse_length(element, ATTR_STROKE_WIDTH, &stroke_width, false, true);
        parse_line_cap(element, ATTR_STROKE_LINECAP, &line_cap);
        parse_line_join(element, ATTR_STROKE_LINEJOIN, &line_join);
        parse_number(element, ATTR_STROKE_MITERLIMIT, &miter_limit, false, true);
    }

    if(state->mode == render_mode_bounding) {
        if(stroke.type == paint_type_none)
            return;
        float line_width = resolve_length(state, &stroke_width, 'o');
        float cap_limit = line_width / 2.f;
        if(line_cap == PLUTOVG_LINE_CAP_SQUARE)
            cap_limit *= PLUTOVG_SQRT2;
        float join_limit = line_width / 2.f;
        if(line_join == PLUTOVG_LINE_JOIN_MITER) {
            join_limit *= miter_limit;
        }

        float delta = MAX(cap_limit, join_limit);
        state->extents.x -= delta;
        state->extents.y -= delta;
        state->extents.w += delta * 2.f;
        state->extents.h += delta * 2.f;
        return;
    }

    paint_t fill = {paint_type_color, {color_type_fixed, 0xFF000000}};
    parse_paint(element, ATTR_FILL, &fill);

    if(apply_paint(state, context, &fill)) {
        float fill_opacity = 1.f;
        parse_number(element, ATTR_FILL_OPACITY, &fill_opacity, true, true);

        plutovg_fill_rule_t fill_rule = PLUTOVG_FILL_RULE_NON_ZERO;
        parse_fill_rule(element, ATTR_FILL_RULE, &fill_rule);

        plutovg_canvas_set_fill_rule(context->canvas, fill_rule);
        plutovg_canvas_set_opacity(context->canvas, fill_opacity * state->opacity);
        plutovg_canvas_set_matrix(context->canvas, &state->matrix);
        plutovg_canvas_fill_path(context->canvas, context->document->path);
    }

    if(apply_paint(state, context, &stroke)) {
        float stroke_opacity = 1.f;
        parse_number(element, ATTR_STROKE_OPACITY, &stroke_opacity, true, true);

        length_t dash_offset = {0.f, length_type_fixed};
        parse_length(element, ATTR_STROKE_DASHOFFSET, &dash_offset, false, true);

        stroke_dash_array_t dash_array = {0};
        parse_dash_array(element, ATTR_STROKE_DASHARRAY, &dash_array);

        float dashes[MAX_DASHES];
        for(int i = 0; i < dash_array.size; ++i) {
            dashes[i] = resolve_length(state, dash_array.data + i, 'o');
        }

        plutovg_canvas_set_dash_offset(context->canvas, resolve_length(state, &dash_offset, 'o'));
        plutovg_canvas_set_dash_array(context->canvas, dashes, dash_array.size);

        plutovg_canvas_set_line_width(context->canvas, resolve_length(state, &stroke_width, 'o'));
        plutovg_canvas_set_line_cap(context->canvas, line_cap);
        plutovg_canvas_set_line_join(context->canvas, line_join);
        plutovg_canvas_set_miter_limit(context->canvas, miter_limit);
        plutovg_canvas_set_opacity(context->canvas, stroke_opacity * state->opacity);
        plutovg_canvas_set_matrix(context->canvas, &state->matrix);
        plutovg_canvas_stroke_path(context->canvas, context->document->path);
    }
}